

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

rcode __thiscall
olc::Renderable::Load(Renderable *this,string *sFile,ResourcePack *pack,bool filter)

{
  _Head_base<0UL,_olc::Sprite_*,_false> _Var1;
  Decal *pDVar2;
  int iVar3;
  pointer __p;
  _Head_base<0UL,_olc::Sprite_*,_false> _Var4;
  Decal *this_00;
  rcode rVar5;
  pointer *__ptr;
  Sprite *local_28;
  
  _Var4._M_head_impl = (Sprite *)operator_new(0x18);
  (_Var4._M_head_impl)->width = 0;
  (_Var4._M_head_impl)->height = 0;
  (_Var4._M_head_impl)->pColData = (Pixel *)0x0;
  (_Var4._M_head_impl)->modeSample = NORMAL;
  local_28 = (Sprite *)0x0;
  _Var1._M_head_impl =
       (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>.
       _M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
       super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl;
  (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>._M_t.
  super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
  super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (Sprite *)0x0) {
    std::default_delete<olc::Sprite>::operator()
              ((default_delete<olc::Sprite> *)this,_Var1._M_head_impl);
  }
  if (local_28 != (Sprite *)0x0) {
    std::default_delete<olc::Sprite>::operator()((default_delete<olc::Sprite> *)&local_28,local_28);
  }
  iVar3 = (**(code **)(*olc::Sprite::loader + 0x10))
                    (olc::Sprite::loader,
                     (this->pSprite)._M_t.
                     super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>._M_t.
                     super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
                     super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl,sFile,pack);
  if (iVar3 == 1) {
    _Var1._M_head_impl =
         (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>.
         _M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
         super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl;
    this_00 = (Decal *)operator_new(0x20);
    olc::Decal::Decal(this_00,_Var1._M_head_impl,filter);
    pDVar2 = (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>
             ._M_t.super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
             super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl;
    (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>._M_t.
    super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
    super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl = this_00;
    rVar5 = OK;
    if (pDVar2 != (Decal *)0x0) {
      (*pDVar2->_vptr_Decal[1])();
    }
  }
  else {
    (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>._M_t.
    super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
    super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl = (Sprite *)0x0;
    rVar5 = NO_FILE;
  }
  return rVar5;
}

Assistant:

olc::rcode Renderable::Load(const std::string &sFile, ResourcePack *pack, bool filter)
	{
		pSprite = std::make_unique<olc::Sprite>();
		if (pSprite->LoadFromFile(sFile, pack) == olc::rcode::OK)
		{
			pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter);
			return olc::rcode::OK;
		}
		else
		{
			pSprite.release();
			pSprite = nullptr;
			return olc::rcode::NO_FILE;
		}
	}